

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtimeline.cpp
# Opt level: O1

void QTimeLine::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int msecs;
  parameter_type *ppVar1;
  QBindingStatus *pQVar2;
  parameter_type t;
  QTimeLinePrivate *this;
  undefined8 uVar3;
  parameter_type pVar4;
  QBindableInterface *pQVar5;
  long *plVar6;
  QObjectData *pQVar7;
  QUntypedPropertyData *data;
  long in_FS_OFFSET;
  undefined1 local_49;
  undefined8 local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      valueChanged((QTimeLine *)*_a[1],_o);
      break;
    case 1:
      frameChanged((QTimeLine *)_o,*_a[1]);
      break;
    case 2:
      stateChanged((QTimeLine *)_o,*_a[1]);
      break;
    case 3:
      local_48 = Forward;
      puStack_40 = &local_49;
      QMetaObject::activate(_o,&staticMetaObject,3,(void **)&local_48);
      break;
    case 4:
      start((QTimeLine *)_o);
      break;
    case 5:
      resume((QTimeLine *)_o);
      break;
    case 6:
      stop((QTimeLine *)_o);
      break;
    case 7:
      setPaused((QTimeLine *)_o,*_a[1]);
      break;
    case 8:
      setCurrentTime((QTimeLine *)_o,*_a[1]);
      break;
    case 9:
      toggleDirection((QTimeLine *)_o);
    }
    switch(_c) {
    case ReadProperty:
      goto switchD_003f65ea_caseD_1;
    case WriteProperty:
      goto switchD_003f65ea_caseD_2;
    default:
      goto switchD_003f65ea_caseD_3;
    case IndexOfMethod:
      goto switchD_003f65ea_caseD_5;
    case BindableProperty:
      break;
    }
  case ReadProperty:
switchD_003f65ea_caseD_1:
    if (5 < (uint)_id) goto LAB_003f67da;
    ppVar1 = (parameter_type *)*_a;
    switch(_id) {
    case 0:
      pVar4 = QObjectCompatProperty<QTimeLinePrivate,_int,_&QTimeLinePrivate::_qt_property_duration_offset,_&QTimeLinePrivate::setDuration,_nullptr,_nullptr>
              ::value((QObjectCompatProperty<QTimeLinePrivate,_int,_&QTimeLinePrivate::_qt_property_duration_offset,_&QTimeLinePrivate::setDuration,_nullptr,_nullptr>
                       *)((long)&(_o->d_ptr).d[1].bindingStorage.bindingStatus + 4));
      break;
    case 1:
      pQVar7 = (_o->d_ptr).d;
      data = (QUntypedPropertyData *)&pQVar7[2].q_ptr;
      goto LAB_003f67b7;
    case 2:
      pVar4 = QObjectCompatProperty<QTimeLinePrivate,_int,_&QTimeLinePrivate::_qt_property_currentTime_offset,_&QTimeLinePrivate::setCurrentTimeForwardToQ,_nullptr,_nullptr>
              ::value((QObjectCompatProperty<QTimeLinePrivate,_int,_&QTimeLinePrivate::_qt_property_currentTime_offset,_&QTimeLinePrivate::setCurrentTimeForwardToQ,_nullptr,_nullptr>
                       *)((long)&(_o->d_ptr).d[2].parent + 4));
      break;
    case 3:
      pVar4 = QObjectCompatProperty<QTimeLinePrivate,_QTimeLine::Direction,_&QTimeLinePrivate::_qt_property_direction_offset,_&QTimeLinePrivate::setDirection,_nullptr,_nullptr>
              ::value((QObjectCompatProperty<QTimeLinePrivate,_QTimeLine::Direction,_&QTimeLinePrivate::_qt_property_direction_offset,_&QTimeLinePrivate::setDirection,_nullptr,_nullptr>
                       *)&(_o->d_ptr).d[2].children);
      break;
    case 4:
      pQVar7 = (_o->d_ptr).d;
      data = (QUntypedPropertyData *)((long)&pQVar7[2].q_ptr + 4);
LAB_003f67b7:
      pQVar2 = (pQVar7->bindingStorage).bindingStatus;
      if ((pQVar2 != (QBindingStatus *)0x0) &&
         (pQVar2->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
        QBindingStorage::registerDependency_helper(&pQVar7->bindingStorage,data);
      }
      pVar4 = *(parameter_type *)data;
      break;
    case 5:
      easingCurve((QTimeLine *)&local_48);
      uVar3 = *(undefined8 *)ppVar1;
      *(undefined8 *)ppVar1 = local_48;
      local_48 = uVar3;
      QEasingCurve::~QEasingCurve((QEasingCurve *)&local_48);
      goto LAB_003f67da;
    }
    *ppVar1 = pVar4;
LAB_003f67da:
    if (_c != BindableProperty) {
      if (_c != WriteProperty) goto switchD_003f65ea_caseD_3;
switchD_003f65ea_caseD_2:
      if ((uint)_id < 6) {
        t = (parameter_type)*_a;
        switch(_id) {
        case 0:
          setDuration((QTimeLine *)_o,*(int *)&t->d_ptr);
          break;
        case 1:
          QObjectBindableProperty<QTimeLinePrivate,_int,_&QTimeLinePrivate::_qt_property_updateInterval_offset,_nullptr>
          ::setValue((QObjectBindableProperty<QTimeLinePrivate,_int,_&QTimeLinePrivate::_qt_property_updateInterval_offset,_nullptr>
                      *)&(_o->d_ptr).d[2].q_ptr,*(parameter_type *)&t->d_ptr);
          break;
        case 2:
          msecs = *(int *)&t->d_ptr;
          this = (QTimeLinePrivate *)(_o->d_ptr).d;
          this->startTime = 0;
          this->currentLoopCount = 0;
          QElapsedTimer::start(&this->timer);
          QTimeLinePrivate::setCurrentTime(this,msecs);
          break;
        case 3:
          setDirection((QTimeLine *)_o,*(Direction *)&t->d_ptr);
          break;
        case 4:
          QObjectBindableProperty<QTimeLinePrivate,_int,_&QTimeLinePrivate::_qt_property_loopCount_offset,_nullptr>
          ::setValue((QObjectBindableProperty<QTimeLinePrivate,_int,_&QTimeLinePrivate::_qt_property_loopCount_offset,_nullptr>
                      *)((long)&(_o->d_ptr).d[2].q_ptr + 4),*(parameter_type *)&t->d_ptr);
          break;
        case 5:
          QObjectBindableProperty<QTimeLinePrivate,_QEasingCurve,_&QTimeLinePrivate::_qt_property_easingCurve_offset,_nullptr>
          ::setValue((QObjectBindableProperty<QTimeLinePrivate,_QEasingCurve,_&QTimeLinePrivate::_qt_property_easingCurve_offset,_nullptr>
                      *)&(_o->d_ptr).d[1].bindingStorage,t);
        }
      }
      if (_c != BindableProperty) goto switchD_003f65ea_caseD_3;
    }
    break;
  case WriteProperty:
    goto switchD_003f65ea_caseD_2;
  default:
    goto switchD_003f65ea_caseD_3;
  case IndexOfMethod:
switchD_003f65ea_caseD_5:
    plVar6 = (long *)_a[1];
    if (((code *)*plVar6 == valueChanged) && (plVar6[1] == 0)) {
      *(undefined4 *)*_a = 0;
      goto switchD_003f65ea_caseD_3;
    }
    if (((code *)*plVar6 == frameChanged) && (plVar6[1] == 0)) {
      *(undefined4 *)*_a = 1;
      goto switchD_003f65ea_caseD_3;
    }
    if (((code *)*plVar6 == stateChanged) && (plVar6[1] == 0)) {
      *(undefined4 *)*_a = 2;
      goto switchD_003f65ea_caseD_3;
    }
    if (((code *)*plVar6 == finished) && (plVar6[1] == 0)) {
      *(undefined4 *)*_a = 3;
      goto switchD_003f65ea_caseD_3;
    }
    if (_c != BindableProperty) {
      if (_c != WriteProperty) {
        if (_c != ReadProperty) goto switchD_003f65ea_caseD_3;
        goto switchD_003f65ea_caseD_1;
      }
      goto switchD_003f65ea_caseD_2;
    }
    break;
  case BindableProperty:
    break;
  }
  switch(_id) {
  case 0:
    plVar6 = (long *)*_a;
    *plVar6 = (long)((long)&(_o->d_ptr).d[1].bindingStorage.bindingStatus + 4);
    pQVar5 = &QtPrivate::
              QBindableInterfaceForProperty<QObjectCompatProperty<QTimeLinePrivate,_int,_&QTimeLinePrivate::_qt_property_duration_offset,_&QTimeLinePrivate::setDuration,_nullptr,_nullptr>,_void>
              ::iface;
    break;
  case 1:
    plVar6 = (long *)*_a;
    *plVar6 = (long)&(_o->d_ptr).d[2].q_ptr;
    pQVar5 = &QtPrivate::
              QBindableInterfaceForProperty<QObjectBindableProperty<QTimeLinePrivate,_int,_&QTimeLinePrivate::_qt_property_updateInterval_offset,_nullptr>,_void>
              ::iface;
    break;
  case 2:
    plVar6 = (long *)*_a;
    *plVar6 = (long)((long)&(_o->d_ptr).d[2].parent + 4);
    pQVar5 = &QtPrivate::
              QBindableInterfaceForProperty<QObjectCompatProperty<QTimeLinePrivate,_int,_&QTimeLinePrivate::_qt_property_currentTime_offset,_&QTimeLinePrivate::setCurrentTimeForwardToQ,_nullptr,_nullptr>,_void>
              ::iface;
    break;
  case 3:
    plVar6 = (long *)*_a;
    *plVar6 = (long)&(_o->d_ptr).d[2].children;
    pQVar5 = &QtPrivate::
              QBindableInterfaceForProperty<QObjectCompatProperty<QTimeLinePrivate,_QTimeLine::Direction,_&QTimeLinePrivate::_qt_property_direction_offset,_&QTimeLinePrivate::setDirection,_nullptr,_nullptr>,_void>
              ::iface;
    break;
  case 4:
    plVar6 = (long *)*_a;
    *plVar6 = (long)((long)&(_o->d_ptr).d[2].q_ptr + 4);
    pQVar5 = &QtPrivate::
              QBindableInterfaceForProperty<QObjectBindableProperty<QTimeLinePrivate,_int,_&QTimeLinePrivate::_qt_property_loopCount_offset,_nullptr>,_void>
              ::iface;
    break;
  case 5:
    plVar6 = (long *)*_a;
    *plVar6 = (long)&(_o->d_ptr).d[1].bindingStorage;
    pQVar5 = &QtPrivate::
              QBindableInterfaceForProperty<QObjectBindableProperty<QTimeLinePrivate,_QEasingCurve,_&QTimeLinePrivate::_qt_property_easingCurve_offset,_nullptr>,_void>
              ::iface;
    break;
  default:
    goto switchD_003f65ea_caseD_3;
  }
  plVar6[1] = (long)pQVar5;
switchD_003f65ea_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTimeLine::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTimeLine *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->valueChanged((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1])), QPrivateSignal()); break;
        case 1: _t->frameChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])), QPrivateSignal()); break;
        case 2: _t->stateChanged((*reinterpret_cast< std::add_pointer_t<QTimeLine::State>>(_a[1])), QPrivateSignal()); break;
        case 3: _t->finished(QPrivateSignal()); break;
        case 4: _t->start(); break;
        case 5: _t->resume(); break;
        case 6: _t->stop(); break;
        case 7: _t->setPaused((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 8: _t->setCurrentTime((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 9: _t->toggleDirection(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QTimeLine::*)(qreal , QPrivateSignal)>(_a, &QTimeLine::valueChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTimeLine::*)(int , QPrivateSignal)>(_a, &QTimeLine::frameChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTimeLine::*)(QTimeLine::State , QPrivateSignal)>(_a, &QTimeLine::stateChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTimeLine::*)(QPrivateSignal)>(_a, &QTimeLine::finished, 3))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->duration(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->updateInterval(); break;
        case 2: *reinterpret_cast<int*>(_v) = _t->currentTime(); break;
        case 3: *reinterpret_cast<Direction*>(_v) = _t->direction(); break;
        case 4: *reinterpret_cast<int*>(_v) = _t->loopCount(); break;
        case 5: *reinterpret_cast<QEasingCurve*>(_v) = _t->easingCurve(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setDuration(*reinterpret_cast<int*>(_v)); break;
        case 1: _t->setUpdateInterval(*reinterpret_cast<int*>(_v)); break;
        case 2: _t->setCurrentTime(*reinterpret_cast<int*>(_v)); break;
        case 3: _t->setDirection(*reinterpret_cast<Direction*>(_v)); break;
        case 4: _t->setLoopCount(*reinterpret_cast<int*>(_v)); break;
        case 5: _t->setEasingCurve(*reinterpret_cast<QEasingCurve*>(_v)); break;
        default: break;
        }
    }
    if (_c == QMetaObject::BindableProperty) {
        switch (_id) {
        case 0: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableDuration(); break;
        case 1: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableUpdateInterval(); break;
        case 2: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableCurrentTime(); break;
        case 3: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableDirection(); break;
        case 4: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableLoopCount(); break;
        case 5: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableEasingCurve(); break;
        default: break;
        }
    }
}